

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NVCtrl.c
# Opt level: O0

int XNVCTRLQueryGvoColorConversion
              (Display *dpy,int screen,float (*colorMatrix) [3],float *colorOffset,float *colorScale
              )

{
  int iVar1;
  undefined1 *puVar2;
  xnvCtrlQueryGvoColorConversionReq *req;
  xnvCtrlQueryGvoColorConversionReply rep;
  XExtDisplayInfo *info;
  float *colorScale_local;
  float *colorOffset_local;
  float (*colorMatrix_local) [3];
  int screen_local;
  Display *dpy_local;
  
  rep._24_8_ = find_display(dpy);
  if (((XExtDisplayInfo *)rep._24_8_ == (XExtDisplayInfo *)0x0) ||
     (((XExtDisplayInfo *)rep._24_8_)->codes == (XExtCodes *)0x0)) {
    dpy_local._4_4_ = 0;
  }
  else if (((XExtDisplayInfo *)rep._24_8_ == (XExtDisplayInfo *)0x0) ||
          (((XExtDisplayInfo *)rep._24_8_)->codes == (XExtCodes *)0x0)) {
    XMissingExtension(dpy,nvctrl_extension_name);
    dpy_local._4_4_ = 0;
  }
  else {
    if (dpy->lock_fns != (_XLockPtrs *)0x0) {
      (*dpy->lock_fns->lock_display)(dpy);
    }
    puVar2 = (undefined1 *)_XGetRequest(dpy,0x16,8);
    *puVar2 = (char)*(undefined4 *)(*(long *)(rep._24_8_ + 0x10) + 4);
    puVar2[1] = 0x16;
    *(int *)(puVar2 + 4) = screen;
    iVar1 = _XReply(dpy,&req,0);
    if (iVar1 == 0) {
      if (dpy->lock_fns != (_XLockPtrs *)0x0) {
        (*dpy->lock_fns->unlock_display)(dpy);
      }
      if (dpy->synchandler != (_func_int__XDisplay_ptr *)0x0) {
        (*dpy->synchandler)(dpy);
      }
      dpy_local._4_4_ = 0;
    }
    else {
      _XRead(dpy,colorMatrix,0x24);
      _XRead(dpy,colorOffset,0xc);
      _XRead(dpy,colorScale,0xc);
      if (dpy->lock_fns != (_XLockPtrs *)0x0) {
        (*dpy->lock_fns->unlock_display)(dpy);
      }
      if (dpy->synchandler != (_func_int__XDisplay_ptr *)0x0) {
        (*dpy->synchandler)(dpy);
      }
      dpy_local._4_4_ = 1;
    }
  }
  return dpy_local._4_4_;
}

Assistant:

Bool XNVCTRLQueryGvoColorConversion (
    Display *dpy,
    int screen,
    float colorMatrix[3][3],
    float colorOffset[3],
    float colorScale[3]
){
    XExtDisplayInfo *info = find_display (dpy);
    xnvCtrlQueryGvoColorConversionReply rep;
    xnvCtrlQueryGvoColorConversionReq *req;
    
    if(!XextHasExtension(info))
        return False;

    XNVCTRLCheckExtension (dpy, info, False);

    LockDisplay (dpy);

    GetReq (nvCtrlQueryGvoColorConversion, req);
    req->reqType = info->codes->major_opcode;
    req->nvReqType = X_nvCtrlQueryGvoColorConversion;
    req->screen = screen;

    if (!_XReply(dpy, (xReply *) &rep, 0, xFalse)) {
        UnlockDisplay (dpy);
        SyncHandle ();
        return False;
    }

    _XRead(dpy, (char *)(colorMatrix), 36);
    _XRead(dpy, (char *)(colorOffset), 12);
    _XRead(dpy, (char *)(colorScale), 12);

    UnlockDisplay (dpy);
    SyncHandle ();

    return True;
}